

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

DString * export_to_json(char *source,simple_token *tree,_Bool array_out)

{
  DString *out;
  stack *s;
  
  out = d_string_new("");
  s = stack_new(5);
  export_token_tree_to_json(out,tree,source,0,s,array_out);
  return out;
}

Assistant:

DString * export_to_json(const char * source, simple_token * tree, bool array_out) {
	DString * out = d_string_new("");
	stack * s = stack_new(5);

	export_token_tree_to_json(out, tree, source, 0, s, array_out);

	return out;
}